

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool __thiscall
duckdb_re2::RE2::DoMatch
          (RE2 *this,StringPiece *text,Anchor re_anchor,size_t *consumed,Arg **args,int n)

{
  ostringstream *this_00;
  bool bVar1;
  char cVar2;
  StringPiece *submatch;
  long lVar3;
  uint nsubmatch;
  StringPiece stkvec [17];
  StringPiece *local_1d8;
  undefined1 local_1b8 [120];
  ios_base local_140 [272];
  
  if ((*(uint *)&this->field_0x44 & 0x1fffffff) == 0) {
    if (n <= this->num_captures_) {
      submatch = (StringPiece *)local_1b8;
      local_1d8 = (StringPiece *)0x0;
      memset(submatch,0,0x110);
      nsubmatch = n + 1U;
      if (n == 0) {
        nsubmatch = 0;
      }
      if (consumed != (size_t *)0x0) {
        nsubmatch = n + 1U;
      }
      if (0x11 < (int)nsubmatch) {
        submatch = (StringPiece *)operator_new__((ulong)nsubmatch << 4);
        memset(submatch,0,(ulong)nsubmatch << 4);
        local_1d8 = submatch;
      }
      bVar1 = Match(this,text,0,text->size_,re_anchor,submatch,nsubmatch);
      if (bVar1) {
        if (consumed != (size_t *)0x0) {
          *consumed = (size_t)(submatch->data_ + (submatch->size_ - (long)text->data_));
        }
        if ((args != (Arg **)0x0 && n != 0) && (0 < n)) {
          lVar3 = 0;
          do {
            cVar2 = (*(code *)(*(undefined8 **)((long)args + lVar3))[1])
                              (*(undefined8 *)((long)&submatch[1].data_ + lVar3 * 2),
                               *(undefined8 *)((long)&submatch[1].size_ + lVar3 * 2),
                               **(undefined8 **)((long)args + lVar3));
            if (cVar2 == '\0') {
              if (local_1d8 == (StringPiece *)0x0) {
                return false;
              }
              operator_delete__(local_1d8);
              return false;
            }
            lVar3 = lVar3 + 8;
          } while ((ulong)(uint)n << 3 != lVar3);
        }
        if (local_1d8 == (StringPiece *)0x0) {
          return true;
        }
      }
      else if (local_1d8 == (StringPiece *)0x0) {
        return false;
      }
      operator_delete__(local_1d8);
      return bVar1;
    }
  }
  else if ((this->options_).log_errors_ == true) {
    this_00 = (ostringstream *)(local_1b8 + 8);
    local_1b8[0] = 0;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Invalid RE2: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(this->error_->_M_dataplus)._M_p,this->error_->_M_string_length);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_140);
  }
  return false;
}

Assistant:

bool RE2::DoMatch(const StringPiece& text,
                  Anchor re_anchor,
                  size_t* consumed,
                  const Arg* const* args,
                  int n) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (NumberOfCapturingGroups() < n) {
    // RE has fewer capturing groups than number of Arg pointers passed in.
    return false;
  }

  // Count number of capture groups needed.
  int nvec;
  if (n == 0 && consumed == NULL)
    nvec = 0;
  else
    nvec = n+1;

  StringPiece* vec;
  StringPiece stkvec[kVecSize];
  StringPiece* heapvec = NULL;

  if (nvec <= static_cast<int>(arraysize(stkvec))) {
    vec = stkvec;
  } else {
    vec = new StringPiece[nvec];
    heapvec = vec;
  }

  if (!Match(text, 0, text.size(), re_anchor, vec, nvec)) {
    delete[] heapvec;
    return false;
  }

  if (consumed != NULL)
    *consumed = static_cast<size_t>(EndPtr(vec[0]) - BeginPtr(text));

  if (n == 0 || args == NULL) {
    // We are not interested in results
    delete[] heapvec;
    return true;
  }

  // If we got here, we must have matched the whole pattern.
  for (int i = 0; i < n; i++) {
    const StringPiece& s = vec[i+1];
    if (!args[i]->Parse(s.data(), s.size())) {
      // TODO: Should we indicate what the error was?
      delete[] heapvec;
      return false;
    }
  }

  delete[] heapvec;
  return true;
}